

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_0::BloomFilterPolicy::CreateFilter
          (BloomFilterPolicy *this,Slice *keys,int n,string *dst)

{
  byte *pbVar1;
  long lVar2;
  size_type sVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = this->bits_per_key_ * (long)n;
  uVar11 = 0x40;
  if (0x40 < uVar9) {
    uVar11 = uVar9;
  }
  sVar3 = dst->_M_string_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (dst,(uVar11 + 7 >> 3) + sVar3,'\0');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (dst,(char)this->k_);
  if (0 < n) {
    pcVar4 = (dst->_M_dataplus)._M_p;
    uVar9 = 0;
    do {
      uVar8 = Hash(keys[uVar9].data_,keys[uVar9].size_,0xbc9f1d34);
      if (this->k_ != 0) {
        uVar6 = uVar8 << 0xf;
        uVar7 = uVar8 >> 0x11;
        uVar10 = 0;
        do {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar11 + 7 & 0xfffffffffffffff8;
          pbVar1 = (byte *)(pcVar4 + (SUB164(ZEXT416(uVar8) % auVar5,0) >> 3) + sVar3);
          *pbVar1 = *pbVar1 | '\x01' << (SUB161(ZEXT416(uVar8) % auVar5,0) & 7);
          uVar8 = uVar8 + (uVar6 | uVar7);
          uVar10 = uVar10 + 1;
        } while (uVar10 < this->k_);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CreateFilter(const Slice* keys, int n, std::string* dst) const override {
    // Compute bloom filter size (in both bits and bytes)
    size_t bits = n * bits_per_key_;

    // For small n, we can see a very high false positive rate.  Fix it
    // by enforcing a minimum bloom filter length.
    if (bits < 64) bits = 64;

    size_t bytes = (bits + 7) / 8;
    bits = bytes * 8;

    const size_t init_size = dst->size();
    dst->resize(init_size + bytes, 0);
    dst->push_back(static_cast<char>(k_));  // Remember # of probes in filter
    char* array = &(*dst)[init_size];
    for (int i = 0; i < n; i++) {
      // Use double-hashing to generate a sequence of hash values.
      // See analysis in [Kirsch,Mitzenmacher 2006].
      uint32_t h = BloomHash(keys[i]);
      const uint32_t delta = (h >> 17) | (h << 15);  // Rotate right 17 bits
      for (size_t j = 0; j < k_; j++) {
        const uint32_t bitpos = h % bits;
        array[bitpos / 8] |= (1 << (bitpos % 8));
        h += delta;
      }
    }
  }